

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O3

void __thiscall gimage::Polygon::reduce(Polygon *this,float tolerance)

{
  ulong uVar1;
  pointer pSVar2;
  pointer pSVar3;
  ulong uVar4;
  ulong uVar5;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  pSVar2 = (this->vertex).
           super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (this->vertex).
           super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)pSVar3 - (long)pSVar2 >> 4;
  if (1 < uVar5) {
    uVar8 = 1;
    uVar7 = 0;
    uVar4 = 1;
    do {
      uVar1 = uVar4 + 1;
      if (uVar1 < uVar5) {
        if (uVar8 <= uVar4) {
          dVar9 = (double)(pSVar2[uVar1].v[1] - pSVar2[uVar7].v[1]);
          dVar10 = (double)(pSVar2[uVar7].v[0] - pSVar2[uVar1].v[0]);
          dVar11 = SQRT(dVar10 * dVar10 + dVar9 * dVar9 + 0.0);
          dVar9 = dVar9 / dVar11;
          dVar10 = dVar10 / dVar11;
          plVar6 = pSVar2[uVar8].v + 1;
          uVar5 = uVar8;
          do {
            if ((double)tolerance <
                ABS(((double)((SVector<long,_2> *)(plVar6 + -1))->v[0] * dVar9 +
                    (double)*plVar6 * dVar10) -
                    ((double)pSVar2[uVar7].v[0] * dVar9 + (double)pSVar2[uVar7].v[1] * dVar10)))
            goto LAB_0013ebee;
            uVar5 = uVar5 + 1;
            plVar6 = plVar6 + 2;
          } while (uVar5 <= uVar4);
        }
      }
      else {
LAB_0013ebee:
        std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::_M_erase
                  (&this->vertex,pSVar2 + uVar7 + 1,pSVar2 + uVar4);
        pSVar2 = (this->vertex).
                 super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar3 = (this->vertex).
                 super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        uVar1 = uVar7 + 2;
        uVar7 = uVar8;
      }
      uVar4 = uVar1;
      uVar8 = uVar7 + 1;
      uVar5 = (long)pSVar3 - (long)pSVar2 >> 4;
    } while (uVar8 < uVar5);
  }
  return;
}

Assistant:

void Polygon::reduce(float tolerance)
{
  size_t i=0;
  size_t k=1;

  while (i+1 < vertex.size())
  {
    // test if linear piece can be extended by one

    bool remove=true;
    if (k+1 < vertex.size())
    {
      // get line between vertex i and k+1 in Hesse normal form

      gmath::Vector2d N;
      N[0]=vertex[k+1][1]-vertex[i][1];
      N[1]=vertex[i][0]-vertex[k+1][0];
      N/=norm(N);

      double d=N[0]*vertex[i][0]+N[1]*vertex[i][1];

      // check if distance of vertices in between i and k+1 exceed tolerance

      remove=false;
      for (size_t j=i+1; j<=k; j++)
      {
        if (std::abs(N[0]*vertex[j][0]+N[1]*vertex[j][1]-d) > tolerance)
        {
          remove=true;
          break;
        }
      }
    }

    // remove all vertices between i and k

    if (remove)
    {
      vertex.erase(vertex.begin()+i+1, vertex.begin()+k);

      i++;
      k=i+1;
    }
    else
    {
      k++;
    }
  }
}